

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall Scope::SetIsObject(Scope *this)

{
  FuncInfo *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Symbol *pSVar4;
  
  do {
    if ((*(ushort *)&this->field_0x44 & 2) != 0) {
      return;
    }
    *(ushort *)&this->field_0x44 = *(ushort *)&this->field_0x44 | 2;
    this_00 = this->func;
    if ((this_00 != (FuncInfo *)0x0) && ((this_00->field_0xb5 & 0x20) == 0)) {
      pSVar4 = this->m_symList;
      do {
        if (pSVar4 == (Symbol *)0x0) break;
        bVar2 = pSVar4->hasFuncAssignment;
        if (bVar2 == true) {
          FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"DelayedObjectScopeAssignment");
        }
        else {
          pSVar4 = pSVar4->next;
        }
      } while (bVar2 == false);
    }
    if (this->scopeType == ScopeType_FunctionBody) {
      if (this_00 == (FuncInfo *)0x0) {
        return;
      }
    }
    else {
      if (this_00 == (FuncInfo *)0x0) {
        return;
      }
      if (this->scopeType != ScopeType_Parameter) {
        return;
      }
    }
    if ((this_00->field_0xb5 & 0x80) != 0) {
      return;
    }
    if (this_00->paramScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                         ,0x4f,"(funcInfo->paramScope)","funcInfo->paramScope");
      if (!bVar2) goto LAB_008b158d;
      *puVar3 = 0;
    }
    SetIsObject(this_00->paramScope);
    if (this_00->bodyScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Scope.cpp"
                         ,0x52,"(funcInfo->bodyScope)","funcInfo->bodyScope");
      if (!bVar2) {
LAB_008b158d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this = this_00->bodyScope;
  } while( true );
}

Assistant:

void Scope::SetIsObject()
{
    if (this->isObject)
    {
        return;
    }

    this->isObject = true;

    // We might set the scope to be object after we have process the symbol
    // (e.g. "With" scope referencing a symbol in an outer scope).
    // If we have func assignment, we need to mark the function to not do stack nested function
    // as these are now assigned to a scope object.
    FuncInfo * funcInfo = this->GetFunc();
    if (funcInfo && !funcInfo->HasMaybeEscapedNestedFunc())
    {
        this->ForEachSymbolUntil([funcInfo](Symbol * const sym)
        {
            if (sym->GetHasFuncAssignment())
            {
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DelayedObjectScopeAssignment")));
                return true;
            }
            return false;
        });
    }

    // If the scope is split (there exists a body and param scope), then it is required that the
    // body and param scope are marked as both requiring either a scope object or a scope slot.
    if ((this->GetScopeType() == ScopeType_FunctionBody || this->GetScopeType() == ScopeType_Parameter)
        && funcInfo && !funcInfo->IsBodyAndParamScopeMerged())
    {
        // The scope is split and one of the scopes (param or body) is being set 
        // as an object, therefore set both the param and body scopes as objects.
        Assert(funcInfo->paramScope);
        funcInfo->paramScope->SetIsObject();

        Assert(funcInfo->bodyScope);
        funcInfo->bodyScope->SetIsObject();
    }
}